

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
BinaryEqualFailure::BinaryEqualFailure
          (BinaryEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          uchar *expected,uchar *actual,size_t size,SimpleString *text)

{
  undefined1 local_a0 [24];
  size_t failStart;
  undefined1 local_68 [8];
  SimpleString actualHex;
  uchar *local_38;
  uchar *actual_local;
  uchar *expected_local;
  size_t lineNumber_local;
  char *fileName_local;
  UtestShell *test_local;
  BinaryEqualFailure *this_local;
  
  local_38 = actual;
  actual_local = expected;
  expected_local = (uchar *)lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = (char *)test;
  test_local = (UtestShell *)this;
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__BinaryEqualFailure_00368c28;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffb8,(SimpleString *)this);
  SimpleString::operator=
            (&(this->super_TestFailure).message_,(SimpleString *)&stack0xffffffffffffffb8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb8);
  StringFromBinaryOrNull(local_68,(size_t)local_38);
  StringFromBinaryOrNull((uchar *)&failStart,(size_t)actual_local);
  TestFailure::createButWasString
            ((TestFailure *)&stack0xffffffffffffff88,(SimpleString *)this,(SimpleString *)&failStart
            );
  SimpleString::operator+=
            (&(this->super_TestFailure).message_,(SimpleString *)&stack0xffffffffffffff88);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffff88);
  SimpleString::~SimpleString((SimpleString *)&failStart);
  if ((actual_local != (uchar *)0x0) && (local_38 != (uchar *)0x0)) {
    for (local_a0._16_8_ = 0; local_38[local_a0._16_8_] == actual_local[local_a0._16_8_];
        local_a0._16_8_ = local_a0._16_8_ + 1) {
    }
    TestFailure::createDifferenceAtPosString
              ((TestFailure *)local_a0,(SimpleString *)this,(size_t)local_68,local_a0._16_8_ * 3 + 1
              );
    SimpleString::operator+=(&(this->super_TestFailure).message_,(SimpleString *)local_a0);
    SimpleString::~SimpleString((SimpleString *)local_a0);
  }
  SimpleString::~SimpleString((SimpleString *)local_68);
  return;
}

Assistant:

BinaryEqualFailure::BinaryEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const unsigned char* expected,
                                       const unsigned char* actual, size_t size, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString actualHex = StringFromBinaryOrNull(actual, size);

	message_ += createButWasString(StringFromBinaryOrNull(expected, size), actualHex);
	if ((expected) && (actual))
	{
		size_t failStart;
		for (failStart = 0; actual[failStart] == expected[failStart]; failStart++)
			;
		message_ += createDifferenceAtPosString(actualHex, (failStart * 3 + 1), failStart);
	}
}